

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismsnoop.cpp
# Opt level: O2

ISMSnoopInstrument * ismsnoop_open(char *path)

{
  FileVersion file_version;
  _Ios_Seekdir _Var1;
  DataType DVar2;
  long lVar3;
  ISMSnoopInstrument *pIVar4;
  long local_2c0;
  ifstream ifs;
  int aiStack_2a0 [122];
  __shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2> local_b8;
  ISMSnoopInstrument *local_a8;
  string *local_a0;
  undefined1 local_98 [8];
  uint32_t file_name_length;
  _Vector_base<char,_std::allocator<char>_> local_88;
  undefined1 local_70 [8];
  shared_ptr<ismsnoop::VersionHandler> handler;
  undefined1 local_58 [8];
  uint16_t width;
  ushort local_3a;
  uint local_38;
  uint16_t depth;
  uint16_t height;
  char magic_byte;
  
  std::ifstream::ifstream(&local_2c0,path,_S_in|_S_bin);
  if (*(int *)((long)aiStack_2a0 + *(long *)(local_2c0 + -0x18)) == 0) {
    std::istream::seekg((long)&local_2c0,_S_beg);
    lVar3 = std::istream::tellg();
    if (0x23 < lVar3) {
      file_version = ismsnoop::read_file_version((ifstream *)&local_2c0);
      ismsnoop::make_handler((ismsnoop *)local_70,file_version);
      ismsnoop::VersionHandler::find_panel_icon((VersionHandler *)local_70,(ifstream *)&local_2c0);
      pIVar4 = (ISMSnoopInstrument *)operator_new(0x48);
      (pIVar4->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pIVar4->name)._M_dataplus._M_p = (pointer)0x0;
      (pIVar4->name)._M_string_length = 0;
      (pIVar4->name).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(pIVar4->name).field_2 + 8) = 0;
      (pIVar4->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar4->panel_icon).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar4->panel_icon).width = 0;
      (pIVar4->panel_icon).height = 0;
      *(undefined8 *)&(pIVar4->panel_icon).depth = 0;
      (pIVar4->name)._M_dataplus._M_p = (pointer)&(pIVar4->name).field_2;
      (pIVar4->name).field_2._M_local_buf[0] = '\0';
      std::istream::get((char *)&local_2c0);
      if (depth._1_1_ == '\0') {
        (pIVar4->panel_icon).width = 0;
        (pIVar4->panel_icon).height = 0;
        (pIVar4->panel_icon).depth = 0;
        std::istream::seekg((long)&local_2c0,_S_end|_S_cur);
      }
      else {
        std::istream::seekg((long)&local_2c0,7);
        ismsnoop::read_panel_icon((InstrumentImage *)local_98,(ifstream *)&local_2c0);
        ismsnoop::InstrumentImage::operator=((InstrumentImage *)pIVar4,(InstrumentImage *)local_98);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_88);
      }
      handler.super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&file_name_length;
      local_a0 = (string *)&pIVar4->name;
      local_a8 = pIVar4;
      do {
        while( true ) {
          std::__shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_b8,
                     (__shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2> *)local_70)
          ;
          _Var1 = std::istream::tellg();
          std::__shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2> *)local_98,
                     &local_b8);
          DVar2 = ismsnoop::find_data((ifstream *)&local_2c0,0,
                                      (shared_ptr<ismsnoop::VersionHandler> *)local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&file_name_length);
          if (DVar2 == None) {
            std::istream::seekg((long)&local_2c0,_Var1);
            std::__shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2> *)
                       local_58,&local_b8);
            DVar2 = ismsnoop::find_data((ifstream *)&local_2c0,2,
                                        (shared_ptr<ismsnoop::VersionHandler> *)local_58);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&width);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
          if (DVar2 != BackgroundImage) break;
          std::istream::read((char *)&local_2c0,(long)local_98);
          std::istream::seekg((long)&local_2c0,local_98._0_4_ + 0x2d);
          std::istream::read((char *)&local_2c0,(long)local_58);
          std::istream::read((char *)&local_2c0,(long)&local_38);
          std::istream::read((char *)&local_2c0,(long)&local_3a);
          std::istream::seekg((long)&local_2c0,
                              (local_38 & 0xffff) * (uint)(ushort)local_58._0_2_ *
                              (uint)(local_3a >> 3));
        }
        if (DVar2 == None) goto LAB_00105d7d;
      } while (DVar2 != InfoText);
      std::istream::read((char *)&local_2c0,(long)&local_38);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_58,(ulong)local_38,
                 (allocator_type *)local_98);
      std::istream::read((char *)&local_2c0,CONCAT62(local_58._2_6_,local_58._0_2_));
      local_98 = (undefined1  [8])&local_88;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)local_98,CONCAT62(local_58._2_6_,local_58._0_2_),_width);
      std::__cxx11::string::operator=(local_a0,(string *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)local_58);
LAB_00105d7d:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&handler);
      pIVar4 = local_a8;
      goto LAB_00105ad2;
    }
  }
  pIVar4 = (ISMSnoopInstrument *)0x0;
LAB_00105ad2:
  std::ifstream::~ifstream(&local_2c0);
  return pIVar4;
}

Assistant:

ISMSnoopInstrument * ismsnoop_open(const char * path)
{
	std::ifstream ifs(path, std::ios_base::in | std::ios_base::binary);

	if(!ifs.good())
	{
		return nullptr;
	}

	ifs.seekg(0, std::ios::end);

	const auto file_length = ifs.tellg();

	if(file_length < ismsnoop::VERSION_INFO)
	{
		return nullptr;
	}

	const auto handler = make_handler(ismsnoop::read_file_version(ifs));

	handler->find_panel_icon(ifs);

	const auto result = new ISMSnoopInstrument();

	char magic_byte;

	ifs.get(magic_byte);

	if (magic_byte == 0)
	{
		// no panel icon
		result->panel_icon.width = 0;
		result->panel_icon.height = 0;
		result->panel_icon.depth = 0;

		ifs.seekg(3, std::ios::cur);
	}
	else
	{
		ifs.seekg(7, std::ios::cur);

		result->panel_icon = ismsnoop::read_panel_icon(ifs);
	}

	ismsnoop::DataType data_type;

	//while (!ifs.eof())
	while ((data_type = find_data(ifs, handler)) != ismsnoop::DataType::None)
	{
		//data_type = find_data(ifs);
		switch (data_type)
		{
			case ismsnoop::DataType::BackgroundImage:
			{
				uint32_t file_name_length;

				ifs.read((char*)(&file_name_length), 4);

				ifs.seekg(45 + file_name_length, std::ios::cur);

				uint16_t width, height, depth;

				ifs.read((char*)(&width), 2);
				ifs.read((char*)(&height), 2);
				ifs.read((char*)(&depth), 2);

				const auto channels = depth / 8;
				const auto image_size = width * height * channels;

				ifs.seekg(image_size, std::ios::cur);

				break;
			}

			case ismsnoop::DataType::InfoText:
			{
				uint32_t name_length;

				ifs.read((char*)(&name_length), 4);

				std::vector<char> buffer(name_length);

				ifs.read(buffer.data(), name_length);

				result->name = std::string(buffer.begin(), buffer.end());

				return result;
			}

			default:
			{
				break;
			}
		}
	}

	return result;
}